

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divideAndConquer.cpp
# Opt level: O2

Num * __thiscall
divideAndConquer::multiply(Num *__return_storage_ptr__,divideAndConquer *this,Num *n1,Num *n2)

{
  ushort uVar1;
  Short SVar2;
  Short SVar3;
  ushort length;
  Num tk1;
  Num x1;
  string str_t;
  Num x4;
  Num x3;
  Num x2;
  Halves a;
  Num t_2m;
  Halves b;
  Num local_250;
  Halves local_228;
  string local_1d8;
  Num local_1b8;
  Num local_190;
  Num local_168;
  pair<Num,_Num> local_140;
  Num local_f0;
  Num local_c8;
  Num local_a0;
  pair<Num,_Num> local_78;
  
  uVar1 = n1->size;
  length = n2->size;
  if (length == 1 || uVar1 == 1) {
    gradeSchoolMultiplication::gradeSchoolMultiplication((gradeSchoolMultiplication *)&local_140);
    gradeSchoolMultiplication::multiply
              (__return_storage_ptr__,(gradeSchoolMultiplication *)&local_140,n1,n2);
    gradeSchoolMultiplication::~gradeSchoolMultiplication((gradeSchoolMultiplication *)&local_140);
  }
  else {
    if (length < uVar1) {
      length = uVar1;
    }
    std::pair<Num,_Num>::pair<Num,_Num,_true>(&local_140);
    std::pair<Num,_Num>::pair<Num,_Num,_true>(&local_78);
    Num::getHalf(&local_228,n1,length);
    std::pair<Num,_Num>::operator=(&local_140,&local_228);
    std::pair<Num,_Num>::~pair(&local_228);
    Num::getHalf(&local_228,n2,length);
    std::pair<Num,_Num>::operator=(&local_78,&local_228);
    std::pair<Num,_Num>::~pair(&local_228);
    Num::Num(&local_228.first);
    Num::Num(&local_168);
    Num::Num(&local_190);
    Num::Num(&local_1b8);
    (**(this->super_Multiplicator)._vptr_Multiplicator)
              (&local_250,this,&local_140.second,&local_78.second);
    Num::operator=(&local_228.first,&local_250);
    Num::~Num(&local_250);
    (**(this->super_Multiplicator)._vptr_Multiplicator)(&local_250,this,&local_140,&local_78.second)
    ;
    Num::operator=(&local_168,&local_250);
    Num::~Num(&local_250);
    (**(this->super_Multiplicator)._vptr_Multiplicator)(&local_250,this,&local_140.second,&local_78)
    ;
    Num::operator=(&local_190,&local_250);
    Num::~Num(&local_250);
    (**(this->super_Multiplicator)._vptr_Multiplicator)(&local_250,this,&local_140,&local_78);
    Num::operator=(&local_1b8,&local_250);
    Num::~Num(&local_250);
    SVar2 = Num::getNumber(&local_168);
    SVar3 = Num::getNumber(&local_190);
    std::__cxx11::to_string(&local_1d8,(uint)SVar3 + (uint)SVar2);
    Num::multiplyByPowerOfTen(&local_250,&local_1b8,length);
    Num::Num(&local_a0,&local_1d8,(Short)local_1d8._M_string_length);
    Num::multiplyByPowerOfTen(&local_f0,&local_a0,length >> 1);
    Num::operator+(&local_c8,&local_250,&local_f0);
    Num::operator+(__return_storage_ptr__,&local_c8,&local_228.first);
    Num::~Num(&local_c8);
    Num::~Num(&local_f0);
    Num::~Num(&local_a0);
    Num::~Num(&local_250);
    std::__cxx11::string::~string((string *)&local_1d8);
    Num::~Num(&local_1b8);
    Num::~Num(&local_190);
    Num::~Num(&local_168);
    Num::~Num(&local_228.first);
    std::pair<Num,_Num>::~pair(&local_78);
    std::pair<Num,_Num>::~pair(&local_140);
  }
  return __return_storage_ptr__;
}

Assistant:

Num divideAndConquer::multiply(const Num& n1, const Num& n2)
{
    if (n1.size == 1 || n2.size == 1)
    {
        gradeSchoolMultiplication t;

        return t.multiply(n1,n2);
    }

    Short m = std::max(n1.size, n2.size);
    Halves a, b;
    a = n1.getHalf(m);
    b = n2.getHalf(m);

    Num x1, x2, x3, x4;
    x1 = multiply(a.second, b.second);
    x2 = multiply(a.first, b.second);
    x3 = multiply(a.second, b.first);
    x4 = multiply(a.first, b.first);

    int t_x2 = x2.getNumber() + x3.getNumber();

    std::string str_t = std::to_string(t_x2);

    Num tk1 = x4.multiplyByPowerOfTen(m);
    Num t_2m (str_t, str_t.size());

    if (m % 2)
    {
        --m;
    }

    Num x5 =  tk1 + (t_2m).multiplyByPowerOfTen(m / 2) + x1;

    return x5;
}